

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O1

pcp_server_state_e handle_wait_io_timeout(pcp_server_t *s)

{
  long lVar1;
  long lVar2;
  timeval ctv;
  timeval local_20;
  
  (s->next_timeout).tv_sec = 0;
  (s->next_timeout).tv_usec = 0;
  pcp_db_foreach_flow(s->ctx,check_flow_timeout,&s->next_timeout);
  if (((s->next_timeout).tv_sec != 0) || ((s->next_timeout).tv_usec != 0)) {
    gettimeofday(&local_20,(__timezone_ptr_t)0x0);
    lVar2 = (s->next_timeout).tv_sec + local_20.tv_sec;
    (s->next_timeout).tv_sec = lVar2;
    lVar1 = (s->next_timeout).tv_usec + local_20.tv_usec;
    lVar2 = lVar2 + lVar1 / 1000000;
    (s->next_timeout).tv_sec = lVar2;
    lVar1 = lVar1 % 1000000;
    (s->next_timeout).tv_usec = lVar1;
    if (lVar1 < 0) {
      (s->next_timeout).tv_usec = lVar1 + 1000000;
      (s->next_timeout).tv_sec = lVar2 + -1;
    }
  }
  return pss_wait_io;
}

Assistant:

static pcp_server_state_e handle_wait_io_timeout(pcp_server_t *s) {
    struct timeval ctv;

    s->next_timeout.tv_sec = 0;
    s->next_timeout.tv_usec = 0;

    pcp_db_foreach_flow(s->ctx, check_flow_timeout, &s->next_timeout);

    if ((s->next_timeout.tv_sec != 0) || (s->next_timeout.tv_usec != 0)) {
        gettimeofday(&ctv, NULL);
        s->next_timeout.tv_sec += ctv.tv_sec;
        s->next_timeout.tv_usec += ctv.tv_usec;
        timeval_align(&s->next_timeout);
    }

    return pss_wait_io;
}